

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poly.cpp
# Opt level: O0

div * __thiscall poly::operator/(div *__return_storage_ptr__,poly *this,poly *f)

{
  int iVar1;
  int iVar2;
  runtime_error *this_00;
  poly *this_01;
  int __denom;
  int local_9c;
  int j;
  int k;
  int i;
  poly *q;
  poly *r;
  poly local_78;
  undefined1 local_21;
  poly *local_20;
  poly *f_local;
  poly *this_local;
  div *ans;
  
  local_21 = 0;
  local_20 = f;
  f_local = this;
  this_local = &__return_storage_ptr__->quot;
  iVar1 = bits(f);
  div::div(__return_storage_ptr__,iVar1,__denom);
  operator=(&__return_storage_ptr__->rem,this);
  iVar1 = degree(local_20);
  if (iVar1 == 0) {
    iVar1 = operator[](local_20,0);
    if (iVar1 == 0) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"Division by is_zero");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    iVar1 = bits(local_20);
    poly(&local_78,(long)iVar1);
    operator=(&__return_storage_ptr__->rem,&local_78);
    ~poly(&local_78);
    operator=(&__return_storage_ptr__->quot,this);
  }
  else {
    this_01 = &__return_storage_ptr__->rem;
    for (j = degree(this_01); iVar1 = degree(local_20), iVar1 <= j; j = j + -1) {
      iVar1 = operator[](this_01,j);
      if (iVar1 != 0) {
        iVar1 = degree(local_20);
        xor_bit(&__return_storage_ptr__->quot,j - iVar1,1);
        for (local_9c = 0; iVar2 = degree(local_20), local_9c <= iVar2; local_9c = local_9c + 1) {
          iVar2 = operator[](local_20,local_9c);
          xor_bit(this_01,local_9c + (j - iVar1),iVar2);
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

poly::div poly::operator/(const poly &f) const {
    div ans(f.bits());
    ans.rem = *this;
    if (f.degree() == 0) {
        if (f[0] == 0)
            throw std::runtime_error("Division by is_zero");
        ans.rem = poly(f.bits());
        ans.quot = *this;
        return ans;
    }

    auto &r = ans.rem;
    auto &q = ans.quot;
    for (int i = r.degree(); i >= f.degree(); i--) {
        if (r[i]) {
            int k = i - f.degree();
            q.xor_bit(k, 1);
            for (int j = 0; j <= f.degree(); j++)
                r.xor_bit(j + k, f[j]);
        }
    }

    return ans;
}